

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool tinyusdz::operator==(Path *lhs,Path *rhs)

{
  __type _Var1;
  string sStack_58;
  string local_38;
  
  if ((lhs->_valid == true) && (rhs->_valid == true)) {
    Path::full_path_name_abi_cxx11_(&local_38,lhs);
    Path::full_path_name_abi_cxx11_(&sStack_58,rhs);
    _Var1 = ::std::operator==(&local_38,&sStack_58);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool operator==(const Path &lhs, const Path &rhs) {
  if (!lhs.is_valid()) {
    return false;
  }

  if (!rhs.is_valid()) {
    return false;
  }

  // Currently simply compare string.
  // FIXME: Better Path identity check.
  return (lhs.full_path_name() == rhs.full_path_name());
}